

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O1

void __thiscall HydEngine::advance(HydEngine *this,int *tstep)

{
  pointer ppPVar1;
  int iVar2;
  pointer ppPVar3;
  int iVar4;
  
  *tstep = 0;
  if (this->engineState == INITIALIZED) {
    this->hydStep = 0;
    iVar4 = (this->network->options).timeOptions[8] - this->currentTime;
    if (this->halted != false) {
      iVar4 = 0;
    }
    if (0 < iVar4) {
      iVar2 = getTimeStep(this);
      if (iVar2 < iVar4) {
        iVar4 = iVar2;
      }
      this->hydStep = iVar4;
    }
    *tstep = this->hydStep;
    updateEnergyUsage(this);
    updateTanks(this);
    iVar4 = this->currentTime + this->hydStep;
    this->currentTime = iVar4;
    if (this->rptTime <= iVar4) {
      this->rptTime = this->rptTime + (this->network->options).timeOptions[5];
    }
    ppPVar1 = (this->network->patterns).super__Vector_base<Pattern_*,_std::allocator<Pattern_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppPVar3 = (this->network->patterns).
                   super__Vector_base<Pattern_*,_std::allocator<Pattern_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppPVar3 != ppPVar1; ppPVar3 = ppPVar3 + 1) {
      (*((*ppPVar3)->super_Element)._vptr_Element[4])(*ppPVar3,(ulong)(uint)this->currentTime);
    }
  }
  return;
}

Assistant:

void HydEngine::advance(int* tstep)
{
    *tstep = 0;
    if ( engineState != HydEngine::INITIALIZED ) return;

    // ... save current results to hydraulics file
    //if ( saveToFile ) errcode = hydWriter.writeResults(hydState, hydTime);

    // ... if time remains, find time (hydStep) until next hydraulic event

    hydStep = 0;
    int timeLeft = network->option(Options::TOTAL_DURATION) - currentTime;
    if ( halted ) timeLeft = 0;
    if ( timeLeft > 0  )
    {
        hydStep = getTimeStep();
        if ( hydStep > timeLeft ) hydStep = timeLeft;
    }
    *tstep = hydStep;

    // ... update energy usage and tank levels over the time step

    updateEnergyUsage();
    updateTanks();

    // ... advance time counters

    currentTime += hydStep;
    if ( currentTime >= rptTime )
    {
        rptTime += network->option(Options::REPORT_STEP);
    }

    // ... advance time patterns

    updatePatterns();
}